

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

int gray_raster_new(FT_Memory memory,gray_PRaster *araster)

{
  gray_PRaster pgVar1;
  FT_Error error;
  int local_1c;
  
  pgVar1 = (gray_PRaster)ft_mem_alloc(memory,8,&local_1c);
  if (local_1c == 0) {
    pgVar1->memory = memory;
  }
  *araster = pgVar1;
  return local_1c;
}

Assistant:

static int
  gray_raster_new( FT_Memory      memory,
                   gray_PRaster*  araster )
  {
    FT_Error      error;
    gray_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }